

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction_internal.cpp
# Opt level: O3

void cfd::TransactionContextUtil::AddScriptHashSign<cfd::TransactionContext>
               (TransactionContext *transaction,OutPoint *outpoint,
               vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *signatures,
               Script *redeem_script,AddressType address_type,bool is_multisig_script)

{
  pointer pSVar1;
  value_type *pvVar2;
  bool bVar3;
  OutPoint *outpoint_00;
  bool bVar4;
  SignDataType SVar5;
  CfdException *pCVar6;
  SignParameter *signature;
  pointer pSVar7;
  value_type *__x;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> sign_params;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> scriptsig;
  Script locking_script;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> local_138;
  TransactionContext *local_118;
  AddressType local_10c;
  ByteData local_108;
  undefined1 local_e8 [32];
  pointer local_c8;
  _func_int **local_a0;
  _Alloc_hider local_90;
  char local_80 [16];
  OutPoint *local_70;
  Script local_68;
  
  local_118 = transaction;
  local_10c = address_type;
  bVar4 = core::Script::IsEmpty(redeem_script);
  if (bVar4) {
    local_e8._0_8_ = "cfd_transaction_internal.cpp";
    local_e8._8_4_ = 0xa7;
    local_e8._16_8_ = (long)"CfdAddScriptHashSign" + 3;
    core::logger::log<>((CfdSourceLocation *)local_e8,kCfdLogLevelWarning,
                        "Failed to AddScriptHashSign. Empty script.");
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    local_e8._0_8_ = local_e8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"Empty script.","");
    core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)local_e8);
    __cxa_throw(pCVar6,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  local_70 = outpoint;
  bVar4 = core::OutPoint::IsValid(outpoint);
  if (bVar4) {
    pSVar7 = (signatures->
             super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pSVar1 = (signatures->
             super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    while( true ) {
      if (pSVar7 == pSVar1) {
        core::Script::Script(&local_68);
        local_138.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_138.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_138.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (address_type == kP2shAddress) {
          bVar4 = true;
          if (is_multisig_script) {
            SignParameter::SignParameter
                      ((SignParameter *)local_e8,(ScriptOperator *)core::ScriptOperator::OP_0);
            std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::
            emplace_back<cfd::SignParameter>(&local_138,(SignParameter *)local_e8);
            local_a0 = (_func_int **)&PTR__ScriptOperator_00722da0;
            if (local_90._M_p != local_80) {
              operator_delete(local_90._M_p);
            }
            if (local_c8 != (pointer)0x0) {
              operator_delete(local_c8);
            }
            if ((_func_int **)local_e8._0_8_ != (_func_int **)0x0) {
              operator_delete((void *)local_e8._0_8_);
            }
          }
          bVar3 = false;
        }
        else {
          if (address_type == kP2wshAddress) {
            bVar4 = false;
          }
          else {
            if (address_type != kP2shP2wshAddress) {
              local_e8._0_8_ = "cfd_transaction_internal.cpp";
              local_e8._8_4_ = 0xcf;
              local_e8._16_8_ = (long)"CfdAddScriptHashSign" + 3;
              core::logger::log<cfd::core::AddressType&>
                        ((CfdSourceLocation *)local_e8,kCfdLogLevelWarning,
                         "Failed to AddScriptHashSign. Invalid address_type: {}",&local_10c);
              pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
              local_e8._0_8_ = local_e8 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_e8,
                         "Invalid address_type. address_type must be \"p2wsh\" or \"p2sh-p2wsh\" or \"p2sh\"."
                         ,"");
              core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)local_e8);
              __cxa_throw(pCVar6,&core::CfdException::typeinfo,core::CfdException::~CfdException);
            }
            core::ScriptUtil::CreateP2wshLockingScript((Script *)local_e8,redeem_script);
            core::Script::operator=(&local_68,(Script *)local_e8);
            core::Script::~Script((Script *)local_e8);
            bVar4 = true;
          }
          bVar3 = true;
          if (is_multisig_script) {
            core::ByteData::ByteData(&local_108);
            SignParameter::SignParameter((SignParameter *)local_e8,&local_108);
            std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::
            emplace_back<cfd::SignParameter>(&local_138,(SignParameter *)local_e8);
            local_a0 = (_func_int **)&PTR__ScriptOperator_00722da0;
            if (local_90._M_p != local_80) {
              operator_delete(local_90._M_p);
            }
            if (local_c8 != (pointer)0x0) {
              operator_delete(local_c8);
            }
            if ((_func_int **)local_e8._0_8_ != (_func_int **)0x0) {
              operator_delete((void *)local_e8._0_8_);
            }
            if (local_108.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_108.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
          }
        }
        pvVar2 = (signatures->
                 super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        pSVar7 = local_138.
                 super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>._M_impl
                 .super__Vector_impl_data._M_start;
        pSVar1 = local_138.
                 super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>._M_impl
                 .super__Vector_impl_data._M_finish;
        for (__x = (signatures->
                   super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>).
                   _M_impl.super__Vector_impl_data._M_start;
            local_138.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>.
            _M_impl.super__Vector_impl_data._M_start = pSVar7,
            local_138.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>.
            _M_impl.super__Vector_impl_data._M_finish = pSVar1, __x != pvVar2; __x = __x + 1) {
          std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::push_back
                    (&local_138,__x);
          pSVar7 = local_138.
                   super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pSVar1 = local_138.
                   super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        }
        SignParameter::SignParameter((SignParameter *)local_e8,redeem_script);
        std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::
        emplace_back<cfd::SignParameter>(&local_138,(SignParameter *)local_e8);
        local_a0 = (_func_int **)&PTR__ScriptOperator_00722da0;
        if (local_90._M_p != local_80) {
          operator_delete(local_90._M_p);
        }
        if (local_c8 != (pointer)0x0) {
          operator_delete(local_c8);
        }
        if ((_func_int **)local_e8._0_8_ != (_func_int **)0x0) {
          operator_delete((void *)local_e8._0_8_);
        }
        outpoint_00 = local_70;
        if (bVar3) {
          AddSign<cfd::TransactionContext>(local_118,local_70,&local_138,true,pSVar7 != pSVar1);
        }
        if (bVar4) {
          bVar4 = core::Script::IsEmpty(&local_68);
          if (bVar4) {
            AddSign<cfd::TransactionContext>
                      (local_118,outpoint_00,&local_138,false,pSVar7 != pSVar1);
          }
          else {
            local_108.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_108.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_108.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            SignParameter::SignParameter((SignParameter *)local_e8,&local_68);
            std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::
            emplace_back<cfd::SignParameter>
                      ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)&local_108
                       ,(SignParameter *)local_e8);
            local_a0 = (_func_int **)&PTR__ScriptOperator_00722da0;
            if (local_90._M_p != local_80) {
              operator_delete(local_90._M_p);
            }
            if (local_c8 != (pointer)0x0) {
              operator_delete(local_c8);
            }
            if ((_func_int **)local_e8._0_8_ != (_func_int **)0x0) {
              operator_delete((void *)local_e8._0_8_);
            }
            AddSign<cfd::TransactionContext>
                      (local_118,outpoint_00,
                       (vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)&local_108
                       ,false,true);
            std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::~vector
                      ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)&local_108
                      );
          }
        }
        std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::~vector(&local_138);
        core::Script::~Script(&local_68);
        return;
      }
      SVar5 = SignParameter::GetDataType(pSVar7);
      if ((SVar5 != kSign) && (SVar5 = SignParameter::GetDataType(pSVar7), SVar5 != kBinary)) break;
      pSVar7 = pSVar7 + 1;
    }
    local_e8._0_8_ = "cfd_transaction_internal.cpp";
    local_e8._8_4_ = 0xb3;
    local_e8._16_8_ = (long)"CfdAddScriptHashSign" + 3;
    local_68._vptr_Script._0_4_ = SignParameter::GetDataType(pSVar7);
    core::logger::log<cfd::SignDataType&>
              ((CfdSourceLocation *)local_e8,kCfdLogLevelWarning,
               "Failed to AddScriptHashSign. Invalid signature type: {}",(SignDataType *)&local_68);
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    local_e8._0_8_ = local_e8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_e8,
               "Invalid signature type. signature type must be \"kSign\" or \"kBinary\".","");
    core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)local_e8);
    __cxa_throw(pCVar6,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  local_e8._0_8_ = "cfd_transaction_internal.cpp";
  local_e8._8_4_ = 0xab;
  local_e8._16_8_ = (long)"CfdAddScriptHashSign" + 3;
  core::logger::log<>((CfdSourceLocation *)local_e8,kCfdLogLevelWarning,
                      "Failed to AddScriptHashSign. Invalid outpoint.");
  pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
  local_e8._0_8_ = local_e8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"Invalid outpoint.","");
  core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)local_e8);
  __cxa_throw(pCVar6,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

void TransactionContextUtil::AddScriptHashSign(
    Tx* transaction, const OutPoint& outpoint,
    const std::vector<SignParameter>& signatures, const Script& redeem_script,
    AddressType address_type, bool is_multisig_script) {
  if (redeem_script.IsEmpty()) {
    warn(CFD_LOG_SOURCE, "Failed to AddScriptHashSign. Empty script.");
    throw CfdException(CfdError::kCfdIllegalArgumentError, "Empty script.");
  }
  if (!outpoint.IsValid()) {
    warn(CFD_LOG_SOURCE, "Failed to AddScriptHashSign. Invalid outpoint.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid outpoint.");
  }
  for (const auto& signature : signatures) {
    if ((signature.GetDataType() != SignDataType::kSign) &&
        (signature.GetDataType() != SignDataType::kBinary)) {
      warn(
          CFD_LOG_SOURCE,
          "Failed to AddScriptHashSign. Invalid signature type: {}",
          signature.GetDataType());
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Invalid signature type. signature type must be \"kSign\" "
          "or \"kBinary\".");  // NOLINT
    }
  }

  bool has_witness = false;
  bool has_scriptsig = false;
  Script locking_script;
  std::vector<SignParameter> sign_params;
  switch (address_type) {
    case AddressType::kP2wshAddress:
      has_witness = true;
      break;
    case AddressType::kP2shP2wshAddress:
      has_witness = true;
      has_scriptsig = true;
      locking_script = ScriptUtil::CreateP2wshLockingScript(redeem_script);
      break;
    case AddressType::kP2shAddress:
      has_scriptsig = true;
      break;
    default:
      warn(
          CFD_LOG_SOURCE,
          "Failed to AddScriptHashSign. Invalid address_type: {}",
          address_type);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Invalid address_type. address_type must be \"p2wsh\" "
          "or \"p2sh-p2wsh\" or \"p2sh\".");  // NOLINT
  }
  if (is_multisig_script) {
    if (has_witness) {
      sign_params.push_back(SignParameter(ByteData()));
    } else {
      sign_params.push_back(SignParameter(ScriptOperator::OP_0));
    }
  }
  for (const auto& signature : signatures) {
    sign_params.push_back(signature);
  }
  bool clear_stack = (sign_params.empty()) ? false : true;
  sign_params.push_back(SignParameter(redeem_script));

  if (has_witness) {
    AddSign(transaction, outpoint, sign_params, true, clear_stack);
  }
  if (has_scriptsig) {
    if (!locking_script.IsEmpty()) {  // p2sh-p2wpkh
      std::vector<SignParameter> scriptsig;
      scriptsig.push_back(SignParameter(locking_script));
      AddSign(transaction, outpoint, scriptsig, false, true);
    } else {
      AddSign(transaction, outpoint, sign_params, false, clear_stack);
    }
  }
}